

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  ~IfcSubContractResource
            ((IfcSubContractResource *)
             &this[-1].super_IfcConstructionResource.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.field_0x20);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}